

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O0

void check_tlist(tri_idx_list_t *tlist,uint *N)

{
  ulong uVar1;
  size_type sVar2;
  DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *pDVar3;
  CoeffReturnType puVar4;
  ostream *poVar5;
  void *this;
  runtime_error *this_00;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  int local_20;
  int local_1c;
  int v;
  int t;
  uint *N_local;
  tri_idx_list_t *tlist_local;
  
  local_1c = 0;
  _v = N;
  N_local = (uint *)tlist;
  do {
    uVar1 = (ulong)local_1c;
    sVar2 = std::
            vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
            ::size((vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                    *)N_local);
    if (sVar2 <= uVar1) {
      return;
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pDVar3 = (DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *)
               std::
               vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                             *)N_local,(long)local_1c);
      Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0>::operator[]
                (pDVar3,(long)local_20);
      pDVar3 = (DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *)
               std::
               vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                             *)N_local,(long)local_1c);
      puVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0>::operator[]
                         (pDVar3,(long)local_20);
      if (*_v <= *puVar4) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar5 = std::operator<<(local_198,"Failed to ensure condition ");
        poVar5 = std::operator<<(poVar5,"is_in_range(tlist[t][v],0,N)");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"at (");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                                );
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = std::operator<<(poVar5,"check_tlist");
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2a0);
        poVar5 = std::operator<<(poVar5,") \n ");
        poVar5 = std::operator<<(poVar5,"tri vertex out of range");
        poVar5 = std::operator<<(poVar5,"t");
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
        poVar5 = std::operator<<(poVar5,"tlist[t][v]");
        poVar5 = std::operator<<(poVar5," = ");
        pDVar3 = (DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *)
                 std::
                 vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                 ::operator[]((vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                               *)N_local,(long)local_1c);
        puVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0>::operator[]
                           (pDVar3,(long)local_20);
        this = (void *)std::ostream::operator<<(poVar5,*puVar4);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this_00,local_1d8);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void check_tlist(const tri_cc_t::tri_idx_list_t &tlist,const uint & N)
{
  for ( int t = 0 ; t < tlist.size(); ++t )
  {
    for( int v = 0 ; v < 3 ; ++v)
    {
      ENSURES(is_in_range(tlist[t][v],0,N))
          << "tri vertex out of range"
          <<STRMVAR(t)
          <<STRMVAR(tlist[t][v])
          <<endl;
    }
  }
}